

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

int __thiscall CTcCodeStream::has_fixup_at_ofs(CTcCodeStream *this,CTcCodeLabel *lbl,ulong ofs)

{
  CTcLabelFixup *pCVar1;
  
  pCVar1 = (CTcLabelFixup *)&lbl->fhead;
  do {
    pCVar1 = pCVar1->nxt;
    if (pCVar1 == (CTcLabelFixup *)0x0) {
      return 0;
    }
  } while (pCVar1->ofs != ofs);
  return 1;
}

Assistant:

int CTcCodeStream::has_fixup_at_ofs(CTcCodeLabel *lbl, ulong ofs)
{
    CTcLabelFixup *fixup;
    
    /* scan for a match */
    for (fixup = lbl->fhead ; fixup != 0 ; fixup = fixup->nxt)
    {
        /* if this is a match, indicate success */
        if (fixup->ofs == ofs)
            return TRUE;
    }

    /* we didn't find a match */
    return FALSE;
}